

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_menu_begin_text(nk_context *ctx,char *title,int len,nk_flags align,nk_vec2 size)

{
  nk_window *win_00;
  nk_widget_layout_states nVar1;
  int iVar2;
  nk_context *local_60;
  uint local_54;
  nk_flags state;
  int is_clicked;
  nk_rect header;
  nk_input *in;
  nk_window *win;
  nk_flags align_local;
  int len_local;
  char *title_local;
  nk_context *ctx_local;
  nk_vec2 size_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x435c,
                  "int nk_menu_begin_text(struct nk_context *, const char *, int, nk_flags, struct nk_vec2)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
         (ctx->current->layout == (nk_panel *)0x0)) {
        size_local.x = 0.0;
      }
      else {
        win_00 = ctx->current;
        nVar1 = nk_widget((nk_rect *)&state,ctx);
        if (nVar1 == NK_WIDGET_INVALID) {
          size_local.x = 0.0;
        }
        else {
          if ((nVar1 == NK_WIDGET_ROM) || (local_60 = ctx, (win_00->flags & 0x1000) != 0)) {
            local_60 = (nk_context *)0x0;
          }
          header._8_8_ = local_60;
          iVar2 = nk_do_button_text(&ctx->last_widget_state,&win_00->buffer,_state,title,len,align,
                                    NK_BUTTON_DEFAULT,&(ctx->style).menu_button,&local_60->input,
                                    (ctx->style).font);
          local_54 = (uint)(iVar2 != 0);
          size_local.x = (float)nk_menu_begin(ctx,win_00,title,local_54,_state,size);
        }
      }
      return (int)size_local.x;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x435e,
                  "int nk_menu_begin_text(struct nk_context *, const char *, int, nk_flags, struct nk_vec2)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x435d,
                "int nk_menu_begin_text(struct nk_context *, const char *, int, nk_flags, struct nk_vec2)"
               );
}

Assistant:

NK_API int
nk_menu_begin_text(struct nk_context *ctx, const char *title, int len,
    nk_flags align, struct nk_vec2 size)
{
    struct nk_window *win;
    const struct nk_input *in;
    struct nk_rect header;
    int is_clicked = nk_false;
    nk_flags state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    state = nk_widget(&header, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || win->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    if (nk_do_button_text(&ctx->last_widget_state, &win->buffer, header,
        title, len, align, NK_BUTTON_DEFAULT, &ctx->style.menu_button, in, ctx->style.font))
        is_clicked = nk_true;
    return nk_menu_begin(ctx, win, title, is_clicked, header, size);
}